

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_config_cmd.c
# Opt level: O0

void test_cmd_namedsections(void)

{
  int iVar1;
  long lVar2;
  cfg_named_section *stype2;
  cfg_named_section *stype1;
  
  cunit_start_test("test_cmd_namedsections");
  iVar1 = cfg_cmd_handle_set(&instance,db,"stype1[name].",&log_buf);
  cunit_named_check(iVar1 == 0,"test_cmd_namedsections",0x75,
                    "Error while adding sectiontype \'stype1[name]\'");
  lVar2 = cfg_db_find_namedsection(db,"stype1","name");
  cunit_named_check(lVar2 != 0,"test_cmd_namedsections",0x78,"\'stype1[name]\' not found");
  if (lVar2 != 0) {
    iVar1 = strcmp(*(char **)(lVar2 + 0x38),"name");
    cunit_named_check(iVar1 == 0,"test_cmd_namedsections",0x7a,"name of section 1 wrong: %s",
                      *(undefined8 *)(lVar2 + 0x38));
  }
  iVar1 = cfg_cmd_handle_set(&instance,db,"stype2[name2].",&log_buf);
  cunit_named_check(iVar1 == 0,"test_cmd_namedsections",0x7e,
                    "Error while adding sectiontype \'stype2[name2]\'");
  lVar2 = cfg_db_find_namedsection(db,"stype2","name2");
  cunit_named_check(lVar2 != 0,"test_cmd_namedsections",0x81,"\'stype2[name]\' not found");
  if (lVar2 != 0) {
    iVar1 = strcmp(*(char **)(lVar2 + 0x38),"name2");
    cunit_named_check(iVar1 == 0,"test_cmd_namedsections",0x83,"name of section 2 wrong: %s",
                      *(undefined8 *)(lVar2 + 0x38));
  }
  iVar1 = cfg_cmd_handle_remove(&instance,db,"stype2[name2].",&log_buf);
  cunit_named_check(iVar1 == 0,"test_cmd_namedsections",0x87,
                    "Error while removing sectiontype \'stype2[name2]\'");
  lVar2 = cfg_db_find_namedsection(db,"stype2","name2");
  cunit_named_check(lVar2 == 0,"test_cmd_namedsections",0x8a,"\'stype2\' is still in the database");
  cunit_end_test("test_cmd_namedsections");
  return;
}

Assistant:

static void
test_cmd_namedsections(void) {
  struct cfg_named_section *stype1, *stype2;

  START_TEST();

  CHECK_TRUE(0 == cfg_cmd_handle_set(&instance, db, "stype1[name].", &log_buf),
      "Error while adding sectiontype 'stype1[name]'");

  stype1 = cfg_db_find_namedsection(db, "stype1", "name");
  CHECK_TRUE(stype1 != NULL, "'stype1[name]' not found");
  if (stype1) {
    CHECK_TRUE(strcmp(stype1->name, "name") == 0, "name of section 1 wrong: %s", stype1->name);
  }

  CHECK_TRUE(0 == cfg_cmd_handle_set(&instance, db, "stype2[name2].", &log_buf),
      "Error while adding sectiontype 'stype2[name2]'");

  stype2 = cfg_db_find_namedsection(db, "stype2", "name2");
  CHECK_TRUE(stype2 != NULL, "'stype2[name]' not found");
  if (stype2) {
    CHECK_TRUE(strcmp(stype2->name, "name2") == 0, "name of section 2 wrong: %s", stype2->name);
  }

  CHECK_TRUE(0 == cfg_cmd_handle_remove(&instance, db, "stype2[name2].", &log_buf),
      "Error while removing sectiontype 'stype2[name2]'");

  stype2 = cfg_db_find_namedsection(db, "stype2", "name2");
  CHECK_TRUE(stype2 == NULL, "'stype2' is still in the database");

  END_TEST();
}